

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O3

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestUploadCommand::Clone(cmCTestUploadCommand *this)

{
  _func_int *p_Var1;
  _func_int **__s;
  long in_RSI;
  
  __s = (_func_int **)operator_new(0x170);
  memset(__s,0,0x160);
  __s[0x17] = (_func_int *)(__s + 0x19);
  __s[0x1b] = (_func_int *)(__s + 0x1d);
  __s[0x1f] = (_func_int *)(__s + 0x21);
  __s[0x23] = (_func_int *)(__s + 0x25);
  __s[0x27] = (_func_int *)(__s + 0x29);
  *__s = (_func_int *)&PTR__cmCTestUploadCommand_009ab3d8;
  __s[0x2b] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  __s[3] = *(_func_int **)(in_RSI + 0x18);
  __s[4] = p_Var1;
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand = __s;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestUploadCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }